

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O1

Api RtAudio::getCompiledApiByName(string *name)

{
  Api AVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    AVar1 = rtaudio_compiled_apis[lVar3];
    iVar2 = std::__cxx11::string::compare((char *)name);
    if (iVar2 == 0) {
      return AVar1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  return UNSPECIFIED;
}

Assistant:

RtAudio::Api RtAudio :: getCompiledApiByName( const std::string &name )
{
  unsigned int i=0;
  for (i = 0; i < rtaudio_num_compiled_apis; ++i)
    if (name == rtaudio_api_names[rtaudio_compiled_apis[i]][0])
      return rtaudio_compiled_apis[i];
  return RtAudio::UNSPECIFIED;
}